

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_table_driven_lite.cc
# Opt level: O3

bool google::protobuf::internal::anon_unknown_15::UnknownFieldHandlerLite::ParseExtension
               (MessageLite *msg,ParseTable *table,CodedInputStream *input,int tag)

{
  long lVar1;
  MessageLite *containing_type;
  ulong uVar2;
  bool bVar3;
  LogMessage *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target;
  undefined1 local_a0 [8];
  CodedOutputStream unknown_fields_stream;
  StringOutputStream unknown_fields_string;
  
  lVar1 = table->extension_offset;
  if (msg == (MessageLite *)0x0 || lVar1 == -1) {
    bVar3 = false;
  }
  else {
    containing_type = (MessageLite *)table->default_instance_void;
    if (table->unknown_field_set == true) {
      LogMessage::LogMessage
                ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/generated_message_table_driven_lite.cc"
                 ,0x57);
      other = LogMessage::operator<<
                        ((LogMessage *)local_a0,"CHECK failed: !table.unknown_field_set: ");
      LogFinisher::operator=((LogFinisher *)&unknown_fields_stream.start_count_,other);
      LogMessage::~LogMessage((LogMessage *)local_a0);
    }
    uVar2 = *(ulong *)((long)&msg->_vptr_MessageLite + table->arena_offset);
    if ((uVar2 & 1) == 0) {
      target = InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>
                         ((InternalMetadata *)((long)&msg->_vptr_MessageLite + table->arena_offset))
      ;
    }
    else {
      target = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((uVar2 & 0xfffffffffffffffe) + 8);
    }
    io::StringOutputStream::StringOutputStream
              ((StringOutputStream *)&unknown_fields_stream.start_count_,target);
    io::CodedOutputStream::CodedOutputStream
              ((CodedOutputStream *)local_a0,
               (ZeroCopyOutputStream *)&unknown_fields_stream.start_count_,false);
    bVar3 = ExtensionSet::ParseField
                      ((ExtensionSet *)((long)&msg->_vptr_MessageLite + lVar1),tag,input,
                       containing_type,(CodedOutputStream *)local_a0);
    io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_a0);
  }
  return bVar3;
}

Assistant:

static bool ParseExtension(MessageLite* msg, const ParseTable& table,
                             io::CodedInputStream* input, int tag) {
    ExtensionSet* extensions = GetExtensionSet(msg, table.extension_offset);
    if (extensions == NULL) {
      return false;
    }

    const MessageLite* prototype = table.default_instance();

    GOOGLE_DCHECK(!table.unknown_field_set);
    io::StringOutputStream unknown_fields_string(
        MutableUnknownFields(msg, table.arena_offset));
    io::CodedOutputStream unknown_fields_stream(&unknown_fields_string, false);
    return extensions->ParseField(tag, input, prototype,
                                  &unknown_fields_stream);
  }